

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O0

void __thiscall UnifiedRegex::RegexStatsDatabase::Print(RegexStatsDatabase *this,DebugWriter *w)

{
  int iVar1;
  RegexStats **ppRVar2;
  int local_a0;
  int local_9c;
  int i_1;
  int i;
  RegexStats totals;
  DebugWriter *w_local;
  RegexStatsDatabase *this_local;
  
  totals.numInsts = (uint64)w;
  RegexStats::RegexStats((RegexStats *)&i_1,(RegexPattern *)0x0);
  Output::Print(L"Regular Expression Statistics\n");
  Output::Print(L"=============================\n");
  local_9c = 0;
  while( true ) {
    iVar1 = JsUtil::
            BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(this->map);
    if (iVar1 <= local_9c) break;
    ppRVar2 = JsUtil::
              BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetValueAt(this->map,local_9c);
    RegexStats::Add((RegexStats *)&i_1,*ppRVar2);
    local_9c = local_9c + 1;
  }
  local_a0 = 0;
  while( true ) {
    iVar1 = JsUtil::
            BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(this->map);
    if (iVar1 <= local_a0) break;
    ppRVar2 = JsUtil::
              BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetValueAt(this->map,local_a0);
    RegexStats::Print(*ppRVar2,(DebugWriter *)totals.numInsts,(RegexStats *)&i_1,
                      this->ticksPerMillisecond);
    local_a0 = local_a0 + 1;
  }
  RegexStats::Print((RegexStats *)&i_1,(DebugWriter *)totals.numInsts,(RegexStats *)0x0,
                    this->ticksPerMillisecond);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&this->allocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             (void *)totals.numInsts,0x1008);
  return;
}

Assistant:

void RegexStatsDatabase::Print(DebugWriter* w)
    {
        RegexStats totals(0);

        Output::Print(_u("Regular Expression Statistics\n"));
        Output::Print(_u("=============================\n"));

        for (int i = 0; i < map->Count(); i++)
            totals.Add(map->GetValueAt(i));

        for (int i = 0; i < map->Count(); i++)
            map->GetValueAt(i)->Print(w, &totals, ticksPerMillisecond);

        totals.Print(w, 0, ticksPerMillisecond);

        allocator->Free(w, sizeof(DebugWriter));
    }